

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintEnum
          (string *__return_storage_ptr__,FieldValuePrinter *this,int32_t val,string *name)

{
  undefined1 local_50 [8];
  StringBaseTextGenerator generator;
  string *name_local;
  int32_t val_local;
  FieldValuePrinter *this_local;
  
  generator.output_.field_2._8_8_ = name;
  anon_unknown_1::StringBaseTextGenerator::StringBaseTextGenerator
            ((StringBaseTextGenerator *)local_50);
  FastFieldValuePrinter::PrintEnum
            (&this->delegate_,val,(string *)generator.output_.field_2._8_8_,
             (BaseTextGenerator *)local_50);
  (anonymous_namespace)::StringBaseTextGenerator::Consume_abi_cxx11_
            (__return_storage_ptr__,local_50);
  anon_unknown_1::StringBaseTextGenerator::~StringBaseTextGenerator
            ((StringBaseTextGenerator *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string TextFormat::FieldValuePrinter::PrintEnum(
    int32_t val, const std::string& name) const {
  FORWARD_IMPL(PrintEnum, val, name);
}